

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* json_parse(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *__return_storage_ptr__,string *fname)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long *__nptr;
  int iVar4;
  int *piVar5;
  long lVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  undefined8 extraout_RAX;
  int iVar9;
  char *pcVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  string str_val;
  string json;
  ifstream ifs;
  string local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_2c0;
  string local_2b8;
  long *local_298;
  char *local_290;
  long local_288 [2];
  string local_278;
  char *local_258;
  undefined8 local_250;
  char local_248;
  undefined7 uStack_247;
  string local_238;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258 = &local_248;
  local_250 = 0;
  local_248 = '\0';
  std::ifstream::ifstream(&local_238,(string *)fname,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    json_parse();
    uVar8 = extraout_RAX;
LAB_0010dd8c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(local_2c0);
    _Unwind_Resume(uVar8);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_298,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238._M_dataplus._M_p + -0x18)),
             0xffffffff,0,0xffffffff);
  std::__cxx11::string::operator=((string *)&local_258,(string *)&local_298);
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  std::ifstream::~ifstream(&local_238);
  if (*local_258 == '{') {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    local_2c0 = &__return_storage_ptr__->_M_t;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    local_298 = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
    iVar4 = (int)local_250;
    if (1 < (int)local_250) {
      uVar14 = 1;
      bVar15 = false;
      bVar3 = false;
      do {
        iVar12 = (int)uVar14;
        cVar11 = local_258[iVar12];
        if (bVar15) {
          if (cVar11 == '\"') {
            paVar2 = &local_2b8.field_2;
            if (!bVar3) {
              iVar9 = iVar12 + 1;
              pcVar10 = local_258 + iVar12;
              do {
                pcVar10 = pcVar10 + 1;
                iVar9 = iVar9 + 1;
              } while (*pcVar10 == ' ');
              for (uVar14 = (ulong)iVar9; local_258[uVar14] == ' '; uVar14 = uVar14 + 1) {
              }
              if (local_258[uVar14] == '\"') {
                bVar3 = true;
                bVar15 = true;
                goto LAB_0010d967;
              }
              for (; (local_258[uVar14] != ',' && (local_258[uVar14] != '}')); uVar14 = uVar14 + 1)
              {
                std::__cxx11::string::push_back((char)&local_298);
              }
            }
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\\u0120","");
            local_2b8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8," ","");
            replace(&local_278,&local_238,&local_2e0,&local_2b8);
            std::__cxx11::string::operator=((string *)&local_238,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\\u010a","");
            local_2b8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"\n","");
            replace(&local_278,&local_238,&local_2e0,&local_2b8);
            std::__cxx11::string::operator=((string *)&local_238,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\\\"","");
            local_2b8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"\"","");
            replace(&local_278,&local_238,&local_2e0,&local_2b8);
            std::__cxx11::string::operator=((string *)&local_238,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != paVar2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            __nptr = local_298;
            piVar5 = __errno_location();
            iVar12 = *piVar5;
            *piVar5 = 0;
            lVar6 = strtol((char *)__nptr,(char **)&local_278,10);
            if ((long *)local_278._M_dataplus._M_p == __nptr) {
              uVar8 = std::__throw_invalid_argument("stoi");
              goto LAB_0010dd8c;
            }
            if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) {
              uVar8 = std::__throw_out_of_range("stoi");
              goto LAB_0010dd8c;
            }
            if (*piVar5 == 0) {
              *piVar5 = iVar12;
            }
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_2c0,&local_238);
            *pmVar7 = (int)lVar6;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_238,0,(char *)local_238._M_string_length,0x12120e);
            bVar3 = false;
            std::__cxx11::string::_M_replace((ulong)&local_298,0,local_290,0x12120e);
            bVar15 = false;
          }
          else {
            if ((cVar11 == '\\') && ((int)(iVar12 + 1U) < iVar4)) {
              cVar11 = (char)&local_298;
              if (!bVar3) {
                cVar11 = (char)&local_238;
              }
              std::__cxx11::string::push_back(cVar11);
              uVar14 = (ulong)(iVar12 + 1U);
            }
            cVar11 = (char)&local_298;
            if (!bVar3) {
              cVar11 = (char)&local_238;
            }
            bVar15 = true;
            std::__cxx11::string::push_back(cVar11);
          }
        }
        else {
          bVar15 = cVar11 == '\"';
        }
LAB_0010d967:
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
      } while ((int)uVar13 < iVar4);
    }
    __return_storage_ptr__ =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_2c0;
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__return_storage_ptr__->_M_t;
}

Assistant:

std::map<std::string, int32_t> json_parse(const std::string & fname) {
    std::map<std::string, int32_t> result;

    // read file into string
    std::string json;
    {
        std::ifstream ifs(fname);
        if (!ifs) {
            fprintf(stderr, "Failed to open %s\n", fname.c_str());
            exit(1);
        }

        json = std::string((std::istreambuf_iterator<char>(ifs)),
                (std::istreambuf_iterator<char>()));
    }

    if (json[0] != '{') {
        return result;
    }

    // parse json
    {
        bool has_key  = false;
        bool in_token = false;

        std::string str_key = "";
        std::string str_val = "";

        int n = json.size();
        for (int i = 1; i < n; ++i) {
            if (!in_token) {
                if (json[i] == ' ') continue;
                if (json[i] == '"') {
                    in_token = true;
                    continue;
                }
            } else {
                if (json[i] == '\\' && i+1 < n) {
                    if (has_key == false) {
                        str_key += json[i];
                    } else {
                        str_val += json[i];
                    }
                    ++i;
                } else if (json[i] == '"') {
                    if (has_key == false) {
                        has_key = true;
                        ++i;
                        while (json[i] == ' ') ++i;
                        ++i; // :
                        while (json[i] == ' ') ++i;
                        if (json[i] != '\"') {
                            while (json[i] != ',' && json[i] != '}') {
                                str_val += json[i++];
                            }
                            has_key = false;
                        } else {
                            in_token = true;
                            continue;
                        }
                    } else {
                        has_key = false;
                    }

                    str_key = ::replace(str_key, "\\u0120", " " ); // \u0120 -> space
                    str_key = ::replace(str_key, "\\u010a", "\n"); // \u010a -> new line
                    str_key = ::replace(str_key, "\\\"",    "\""); // \\\"   -> "

                    try {
                        result[str_key] = std::stoi(str_val);
                    } catch (...) {
                        //fprintf(stderr, "%s: ignoring key '%s' with value '%s'\n", fname.c_str(), str_key.c_str(), str_val.c_str());

                    }
                    str_key = "";
                    str_val = "";
                    in_token = false;
                    continue;
                }
                if (has_key == false) {
                    str_key += json[i];
                } else {
                    str_val += json[i];
                }
            }
        }
    }

    return result;
}